

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall CBlockPolicyEstimator::FlushUnconfirmed(CBlockPolicyEstimator *this)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  Logger *pLVar6;
  Level level;
  _Base_ptr mutexIn;
  CBlockPolicyEstimator *this_00;
  double *args_1;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  double local_e8;
  size_t num_entries;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  string local_60;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = std::chrono::_V2::steady_clock::now();
  mutexIn = (_Base_ptr)&this->m_cs_fee_estimator;
  this_00 = (CBlockPolicyEstimator *)&criticalblock8;
  args_1 = (double *)0x41a;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)this_00,
             (AnnotatedMixin<std::mutex> *)mutexIn,"m_cs_fee_estimator",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
             ,0x41a,false);
  sVar4 = (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  num_entries = sVar4;
  while (level = (Level)mutexIn, sVar4 != 0) {
    mutexIn = (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1;
    this_00 = this;
    _removeTx(this,(uint256 *)mutexIn,false);
    sVar4 = (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  lVar5 = std::chrono::_V2::steady_clock::now();
  bVar2 = ::LogAcceptCategory((LogFlags)this_00,level);
  if (bVar2) {
    local_e8 = (double)(lVar5 - lVar3) / 1000000000.0;
    pLVar6 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar6);
    if (bVar2) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<unsigned_long,double>
                (&local_60,(tinyformat *)"Recorded %u unconfirmed txs from mempool in %.3fs\n",
                 (char *)&num_entries,(unsigned_long *)&local_e8,args_1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      pLVar6 = LogInstance();
      local_60._M_dataplus._M_p = &DAT_00000058;
      local_60._M_string_length = 0xccc4d7;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x58;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "FlushUnconfirmed";
      logging_function._M_len = 0x10;
      BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0x422,ESTIMATEFEE,Debug);
      std::__cxx11::string::~string((string *)&log_msg);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock8.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBlockPolicyEstimator::FlushUnconfirmed()
{
    const auto startclear{SteadyClock::now()};
    LOCK(m_cs_fee_estimator);
    size_t num_entries = mapMemPoolTxs.size();
    // Remove every entry in mapMemPoolTxs
    while (!mapMemPoolTxs.empty()) {
        auto mi = mapMemPoolTxs.begin();
        _removeTx(mi->first, false); // this calls erase() on mapMemPoolTxs
    }
    const auto endclear{SteadyClock::now()};
    LogDebug(BCLog::ESTIMATEFEE, "Recorded %u unconfirmed txs from mempool in %.3fs\n", num_entries, Ticks<SecondsDouble>(endclear - startclear));
}